

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

int sexp_grow_heap(sexp_conflict ctx,size_t size,size_t chunk_size)

{
  sexp_heap_conflict chunk_size_00;
  ulong uVar1;
  sexp_heap_conflict psVar2;
  ulong in_RSI;
  long in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  sexp_heap_conflict h;
  sexp_heap_conflict tmp;
  size_t new_size;
  size_t cur_size;
  ulong local_40;
  size_t in_stack_ffffffffffffffd0;
  
  chunk_size_00 = sexp_heap_last(*(sexp_heap_conflict *)(in_RDI + 0x70));
  local_40 = in_RSI;
  if (in_RSI < chunk_size_00->size) {
    local_40 = chunk_size_00->size;
  }
  uVar1 = local_40 + 0x1f & 0xffffffffffffffe0;
  auVar4._8_4_ = (int)(uVar1 >> 0x20);
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = 0x45300000;
  dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  dVar3 = ceil(dVar3 + dVar3);
  psVar2 = sexp_make_heap((long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f,
                          in_stack_ffffffffffffffd0,(size_t)chunk_size_00);
  if (psVar2 != (sexp_heap_conflict)0x0) {
    psVar2->next = chunk_size_00->next;
    chunk_size_00->next = psVar2;
  }
  return (int)(chunk_size_00->next != (sexp_heap)0x0);
}

Assistant:

int sexp_grow_heap (sexp ctx, size_t size, size_t chunk_size) {
  size_t cur_size, new_size;
  sexp_heap tmp, h = sexp_heap_last(sexp_context_heap(ctx));
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
  for (tmp=sexp_context_heap(ctx); tmp; tmp=tmp->next)
    if (tmp->chunk_size == size) {
      while (tmp->next && tmp->next->chunk_size == size)
        tmp = tmp->next;
      h = tmp;
      chunk_size = size;
      break;
    }
#endif
  cur_size = h->size;
  new_size = (size_t) ceil(SEXP_GROW_HEAP_FACTOR * (double) (sexp_heap_align(((cur_size > size) ? cur_size : size))));
  tmp = sexp_make_heap(new_size, h->max_size, chunk_size);
  if (tmp) {
    tmp->next = h->next;
    h->next = tmp;
  }
  return (h->next != NULL);
}